

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveSpaceForPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          GraphicsPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  LayoutElement *pLVar1;
  uint uVar2;
  uint uVar3;
  Uint32 i;
  ulong uVar4;
  long lVar5;
  
  FixedLinearAllocator::
  AddSpace<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
            (MemPool,1);
  ReserveResourceLayout(&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,MemPool)
  ;
  ReserveResourceSignatures(this,&CreateInfo->super_PipelineStateCreateInfo,MemPool);
  uVar4 = (ulong)(CreateInfo->GraphicsPipeline).InputLayout.NumElements;
  if (uVar4 != 0) {
    FixedLinearAllocator::AddSpace<Diligent::LayoutElement>(MemPool,uVar4);
    lVar5 = 0;
    uVar3 = 0;
    for (uVar4 = 0; uVar4 < (CreateInfo->GraphicsPipeline).InputLayout.NumElements;
        uVar4 = uVar4 + 1) {
      pLVar1 = (CreateInfo->GraphicsPipeline).InputLayout.LayoutElements;
      FixedLinearAllocator::AddSpaceForString
                (MemPool,*(Char **)((long)&pLVar1->HLSLSemantic + lVar5),0);
      uVar2 = *(int *)((long)&pLVar1->BufferSlot + lVar5) + 1;
      if (uVar3 <= uVar2) {
        uVar3 = uVar2;
      }
      lVar5 = lVar5 + 0x28;
    }
    FixedLinearAllocator::AddSpace<unsigned_int>(MemPool,(ulong)uVar3);
    return;
  }
  return;
}

Assistant:

void ReserveSpaceForPipelineDesc(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                     FixedLinearAllocator&                  MemPool) noexcept
    {
        MemPool.AddSpace<GraphicsPipelineData>();
        ReserveResourceLayout(CreateInfo.PSODesc.ResourceLayout, MemPool);
        ReserveResourceSignatures(CreateInfo, MemPool);

        const InputLayoutDesc& InputLayout = CreateInfo.GraphicsPipeline.InputLayout;
        if (InputLayout.NumElements > 0)
        {
            Uint32 BufferSlotsUsed = 0;
            MemPool.AddSpace<LayoutElement>(InputLayout.NumElements);
            for (Uint32 i = 0; i < InputLayout.NumElements; ++i)
            {
                const LayoutElement& LayoutElem = InputLayout.LayoutElements[i];
                MemPool.AddSpaceForString(LayoutElem.HLSLSemantic);
                BufferSlotsUsed = std::max(BufferSlotsUsed, LayoutElem.BufferSlot + 1);
            }

            MemPool.AddSpace<Uint32>(BufferSlotsUsed);
        }

        static_assert(std::is_trivially_destructible<decltype(*InputLayout.LayoutElements)>::value, "Add destructor for this object to Destruct()");
    }